

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pace.cpp
# Opt level: O0

void test_new_elimination_order(string *name,ArrayIDIDFunc *order)

{
  int iVar1;
  void *pvVar2;
  size_t sVar3;
  ssize_t sVar4;
  long lVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  ArrayIDFunc<int> *in_RSI;
  string msg_2;
  string msg_1;
  string s;
  char *new_decomposition;
  int depth;
  ArrayIDFunc<int> parent;
  string msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffca0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffca8;
  char *in_stack_fffffffffffffcc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcd8;
  undefined8 in_stack_fffffffffffffce8;
  int __val;
  string local_2e0 [16];
  ArrayIDFunc<int> *in_stack_fffffffffffffd30;
  string local_2c0 [32];
  string local_2a0 [32];
  string local_280 [32];
  string local_260 [32];
  string local_240 [32];
  string local_220 [32];
  string local_200 [32];
  string local_1e0 [32];
  string local_1c0 [20];
  int in_stack_fffffffffffffe54;
  ArrayIDFunc<int> *in_stack_fffffffffffffe58;
  string local_1a0 [32];
  string local_180 [24];
  ArrayIDIDFunc *in_stack_fffffffffffffe98;
  ArrayIDIDFunc *in_stack_fffffffffffffea0;
  ArrayIDIDFunc *in_stack_fffffffffffffea8;
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  int local_b4;
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  string local_30 [48];
  
  __val = (int)((ulong)in_stack_fffffffffffffce8 >> 0x20);
  iVar1 = ArrayIDFunc<int>::preimage_count(in_RSI);
  if (iVar1 == 0) {
    if ((print_verbose_status & 1U) != 0) {
      std::operator+(in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
      get_milli_time();
      std::__cxx11::to_string((unsigned_long_long)in_stack_fffffffffffffcd8);
      std::operator+(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
      std::operator+(in_stack_fffffffffffffca8,(char *)in_stack_fffffffffffffca0);
      std::__cxx11::string::~string(local_50);
      std::__cxx11::string::~string(local_90);
      std::__cxx11::string::~string(local_70);
      pvVar2 = (void *)std::__cxx11::string::data();
      sVar3 = std::__cxx11::string::length();
      sVar4 = write(2,pvVar2,sVar3);
      ignore_return_value((int)sVar4);
      std::__cxx11::string::~string(local_30);
    }
  }
  else {
    compute_parent_array_from_elimination_order
              (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    local_b4 = compute_tree_depth_of_parent_array(in_stack_fffffffffffffd30);
    if (local_b4 < best_tree_depth) {
      format_parent_array_abi_cxx11_(in_stack_fffffffffffffe58,in_stack_fffffffffffffe54);
      lVar5 = std::__cxx11::string::length();
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              operator_new__(lVar5 + 1);
      pbVar6 = __lhs;
      local_c0 = __lhs;
      pvVar2 = (void *)std::__cxx11::string::c_str();
      iVar1 = (int)((ulong)pbVar6 >> 0x20);
      lVar5 = std::__cxx11::string::length();
      memcpy(__lhs,pvVar2,lVar5 + 1);
      std::__cxx11::string::~string(local_e0);
      if (local_b4 < best_tree_depth) {
        pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 best_decomposition;
        if (best_decomposition != (char *)0x0) {
          operator_delete__(best_decomposition);
          pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   best_decomposition;
        }
        best_decomposition = (char *)local_c0;
        local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        best_tree_depth = local_b4;
        if ((print_status & 1U) != 0) {
          std::__cxx11::to_string(iVar1);
          std::operator+((char *)in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
          std::operator+(in_stack_fffffffffffffca8,(char *)in_stack_fffffffffffffca0);
          get_milli_time();
          std::__cxx11::to_string((unsigned_long_long)__lhs);
          std::operator+(__lhs,pbVar6);
          std::operator+(in_stack_fffffffffffffca8,(char *)in_stack_fffffffffffffca0);
          std::operator+(in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
          std::operator+(in_stack_fffffffffffffca8,(char *)in_stack_fffffffffffffca0);
          std::__cxx11::string::~string(local_120);
          std::__cxx11::string::~string(local_140);
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffea0);
          std::__cxx11::string::~string(local_1e0);
          std::__cxx11::string::~string(local_180);
          std::__cxx11::string::~string(local_1a0);
          std::__cxx11::string::~string(local_1c0);
          pvVar2 = (void *)std::__cxx11::string::data();
          sVar3 = std::__cxx11::string::length();
          sVar4 = write(2,pvVar2,sVar3);
          ignore_return_value((int)sVar4);
          std::__cxx11::string::~string(local_100);
        }
      }
      if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        operator_delete__(local_c0);
      }
    }
    else if ((print_verbose_status & 1U) != 0) {
      std::__cxx11::to_string(__val);
      std::operator+((char *)in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
      std::operator+(in_stack_fffffffffffffca8,(char *)in_stack_fffffffffffffca0);
      get_milli_time();
      std::__cxx11::to_string((unsigned_long_long)in_stack_fffffffffffffcd8);
      std::operator+(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
      std::operator+(in_stack_fffffffffffffca8,(char *)in_stack_fffffffffffffca0);
      std::operator+(in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
      std::operator+(in_stack_fffffffffffffca8,(char *)in_stack_fffffffffffffca0);
      std::__cxx11::string::~string(local_220);
      std::__cxx11::string::~string(local_240);
      std::__cxx11::string::~string(local_260);
      std::__cxx11::string::~string(local_2e0);
      std::__cxx11::string::~string(local_280);
      std::__cxx11::string::~string(local_2a0);
      std::__cxx11::string::~string(local_2c0);
      in_stack_fffffffffffffca0 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::__cxx11::string::data();
      sVar3 = std::__cxx11::string::length();
      sVar4 = write(2,in_stack_fffffffffffffca0,sVar3);
      ignore_return_value((int)sVar4);
      std::__cxx11::string::~string(local_200);
    }
    ArrayIDFunc<int>::~ArrayIDFunc((ArrayIDFunc<int> *)in_stack_fffffffffffffca0);
  }
  return;
}

Assistant:

void test_new_elimination_order(std::string name, const ArrayIDIDFunc& order)
{
    if(order.preimage_count() == 0){
        if (print_verbose_status) {
            string msg = name+" was aborted after " + to_string(get_milli_time() - program_start_milli_time) + "\n";
            ignore_return_value(write(STDERR_FILENO, msg.data(), msg.length()));
        }
        return;
    }
    ArrayIDFunc<int> parent = compute_parent_array_from_elimination_order(tail, head, order);
    int depth = compute_tree_depth_of_parent_array(parent);
    if (depth < best_tree_depth) {
        char* new_decomposition;
        {
            std::string s = format_parent_array(parent, depth);
            new_decomposition = new char[s.length() + 1];
            memcpy(new_decomposition, s.c_str(), s.length() + 1);
        }
#ifdef PARALLELIZE
#pragma omp critical
#endif
        {
            if (depth < best_tree_depth) {
                delete[] best_decomposition;
                best_decomposition = new_decomposition;
                new_decomposition = nullptr;
                best_tree_depth = depth;
                if (print_status) {
                    string msg = "depth " + to_string(best_tree_depth) + " found after " + to_string(get_milli_time() - program_start_milli_time) + " ms by " + name + "\n";
                    ignore_return_value(write(STDERR_FILENO, msg.data(), msg.length()));
                }
            }
        }
        delete[] new_decomposition;
    }else{
        if (print_verbose_status) {
            string msg = "not better depth " + to_string(depth) + " found after " + to_string(get_milli_time() - program_start_milli_time) + " ms by " + name + "\n";
            ignore_return_value(write(STDERR_FILENO, msg.data(), msg.length()));
        }
    }
}